

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

weak_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::find_disconnect_candidate_torrent(session_impl *this)

{
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  __r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  weak_ptr<libtorrent::aux::torrent> wVar2;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  __r = ::std::
        __min_element<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>const*,std::vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<libtorrent::aux::torrent>const&,std::shared_ptr<libtorrent::aux::torrent>const&)>>
                  (*(shared_ptr<libtorrent::aux::torrent> **)(in_RSI + 0x1428),
                   *(shared_ptr<libtorrent::aux::torrent> **)(in_RSI + 0x1430),
                   (_Iter_comp_iter<bool_(*)(const_std::shared_ptr<libtorrent::aux::torrent>_&,_const_std::shared_ptr<libtorrent::aux::torrent>_&)>
                    )0x2944a3);
  if (__r._M_current == *(shared_ptr<libtorrent::aux::torrent> **)(in_RSI + 0x1430)) {
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::torrent,void>
              ((__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)this,&local_28);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::torrent,void>
              ((__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)this,
               &(__r._M_current)->
                super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    _Var1._M_pi = extraout_RDX;
  }
  wVar2.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  wVar2.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<libtorrent::aux::torrent>)
         wVar2.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<torrent> session_impl::find_disconnect_candidate_torrent() const
	{
		auto const i = std::min_element(m_torrents.begin(), m_torrents.end()
			, &compare_disconnect_torrent);

		TORRENT_ASSERT(i != m_torrents.end());
		if (i == m_torrents.end()) return std::shared_ptr<torrent>();

		return *i;
	}